

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChannelList.cpp
# Opt level: O2

void __thiscall
Imf_2_5::ChannelList::channelsWithPrefix
          (ChannelList *this,char *prefix,Iterator *first,Iterator *last)

{
  _Base_ptr p_Var1;
  int iVar2;
  iterator iVar3;
  size_t sVar4;
  Name NStack_128;
  
  Name::Name(&NStack_128,prefix);
  iVar3 = std::
          _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
          ::lower_bound((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>_>
                         *)this,&NStack_128);
  (last->_i)._M_node = iVar3._M_node;
  (first->_i)._M_node = iVar3._M_node;
  sVar4 = strlen(prefix);
  while( true ) {
    p_Var1 = (last->_i)._M_node;
    if ((_Rb_tree_header *)p_Var1 == &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    iVar2 = strncmp((char *)(p_Var1 + 1),prefix,(long)(int)sVar4);
    if (0 < iVar2) break;
    std::_Rb_tree_iterator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Channel>_>::operator++(&last->_i)
    ;
  }
  return;
}

Assistant:

void		
ChannelList::channelsWithPrefix (const char prefix[],
				 Iterator &first,
				 Iterator &last)
{
    first = last = _map.lower_bound (prefix);
    size_t n = int(strlen (prefix));

    while (last != Iterator (_map.end()) &&
	   strncmp (last.name(), prefix, n) <= 0)
    {
	++last;
    }
}